

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.h
# Opt level: O0

CordRep * __thiscall
absl::lts_20250127::cord_internal::CordRepBtreeNavigator::
Init<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
          (CordRepBtreeNavigator *this,CordRepBtree *tree)

{
  int iVar1;
  size_t sVar2;
  CordRep *pCVar3;
  int __c;
  char *local_28;
  size_t index;
  CordRepBtree *pCStack_18;
  int height;
  CordRepBtree *tree_local;
  CordRepBtreeNavigator *this_local;
  
  if (tree == (CordRepBtree *)0x0) {
    __assert_fail("tree != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                  ,0xae,
                  "CordRep *absl::cord_internal::CordRepBtreeNavigator::Init(CordRepBtree *) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                 );
  }
  sVar2 = CordRepBtree::size(tree);
  if (sVar2 != 0) {
    iVar1 = CordRepBtree::height(tree);
    if (iVar1 < 0xc) {
      index._4_4_ = CordRepBtree::height(tree);
      this->height_ = index._4_4_;
      local_28 = CordRepBtree::index(tree,(char *)0x0,__c);
      this->node_[index._4_4_] = tree;
      this->index_[index._4_4_] = (uint8_t)local_28;
      pCStack_18 = tree;
      while (index._4_4_ = index._4_4_ + -1, -1 < index._4_4_) {
        pCVar3 = CordRepBtree::Edge(pCStack_18,(size_t)local_28);
        pCStack_18 = CordRep::btree(pCVar3);
        this->node_[index._4_4_] = pCStack_18;
        local_28 = CordRepBtree::index(pCStack_18,(char *)0x0,(int)pCStack_18);
        this->index_[index._4_4_] = (uint8_t)local_28;
      }
      pCVar3 = CordRepBtree::Edge(this->node_[0],(size_t)local_28);
      return pCVar3;
    }
    __assert_fail("tree->height() <= CordRepBtree::kMaxHeight",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                  ,0xb0,
                  "CordRep *absl::cord_internal::CordRepBtreeNavigator::Init(CordRepBtree *) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                 );
  }
  __assert_fail("tree->size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                ,0xaf,
                "CordRep *absl::cord_internal::CordRepBtreeNavigator::Init(CordRepBtree *) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
               );
}

Assistant:

inline CordRep* CordRepBtreeNavigator::Init(CordRepBtree* tree) {
  assert(tree != nullptr);
  assert(tree->size() > 0);
  assert(tree->height() <= CordRepBtree::kMaxHeight);
  int height = height_ = tree->height();
  size_t index = tree->index(edge_type);
  node_[height] = tree;
  index_[height] = static_cast<uint8_t>(index);
  while (--height >= 0) {
    tree = tree->Edge(index)->btree();
    node_[height] = tree;
    index = tree->index(edge_type);
    index_[height] = static_cast<uint8_t>(index);
  }
  return node_[0]->Edge(index);
}